

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_>
            *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)((long)pointer + 0x38));
    Array<char>::~Array((Array<char> *)((long)pointer + 0x20));
    Own<const_kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::~Own
              ((Own<const_kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t> *)
               ((long)pointer + 0x10));
  }
  operator_delete(pointer,0x48);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }